

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall
ParserTest_StringsWithInterpolation_Test::~ParserTest_StringsWithInterpolation_Test
          (ParserTest_StringsWithInterpolation_Test *this)

{
  ParserTest_StringsWithInterpolation_Test *this_local;
  
  ~ParserTest_StringsWithInterpolation_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, StringsWithInterpolation) {
  P parser;
  EXPECT_TRUE(parser.parse("a = 'hi'"));
  EXPECT_FALSE(parser.parse("a = 'hi"));
  EXPECT_FALSE(parser.parse("a = 'hi\\"));
  EXPECT_FALSE(parser.parse("a = 'hi\\4 there'"));
  EXPECT_TRUE(parser.parse("a = 'h${there}i'"));
  EXPECT_FALSE(parser.parse("a = 'h$there}i'"));
  EXPECT_FALSE(parser.parse("a = 'h${t-here}i'"));
}